

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O3

void __thiscall
enact::ReferenceExpr::ReferenceExpr
          (ReferenceExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr,
          Token *oper,optional<enact::Token> *permission,optional<enact::Token> *region)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ReferenceExpr_00127600;
  (this->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (expr->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
       super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
       super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (expr->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->oper).type = oper->type;
  paVar1 = &(this->oper).lexeme.field_2;
  (this->oper).lexeme._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (oper->lexeme)._M_dataplus._M_p;
  paVar2 = &(oper->lexeme).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(oper->lexeme).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->oper).lexeme.field_2 + 8) = uVar4;
  }
  else {
    (this->oper).lexeme._M_dataplus._M_p = pcVar3;
    (this->oper).lexeme.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->oper).lexeme._M_string_length = (oper->lexeme)._M_string_length;
  (oper->lexeme)._M_dataplus._M_p = (pointer)paVar2;
  (oper->lexeme)._M_string_length = 0;
  (oper->lexeme).field_2._M_local_buf[0] = '\0';
  (this->oper).col = oper->col;
  (this->oper).line = oper->line;
  std::_Optional_payload_base<enact::Token>::_Optional_payload_base
            ((_Optional_payload_base<enact::Token> *)&this->permission,
             (permission->super__Optional_base<enact::Token,_false,_false>)._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_engaged,
             (_Optional_payload_base<enact::Token> *)permission);
  std::_Optional_payload_base<enact::Token>::_Optional_payload_base
            ((_Optional_payload_base<enact::Token> *)&this->region,
             (region->super__Optional_base<enact::Token,_false,_false>)._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_engaged,
             (_Optional_payload_base<enact::Token> *)region);
  return;
}

Assistant:

ReferenceExpr(
                std::unique_ptr<Expr> expr,
                Token oper,
                std::optional<Token> permission,
                std::optional<Token> region) :
                expr{std::move(expr)},
                oper{std::move(oper)},
                permission{std::move(permission)},
                region{std::move(region)} {}